

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * GetFunctionTable(ExpressionContext *ctx,SynBase *source,FunctionData *function)

{
  uint uniqueId;
  TypeBase *pTVar1;
  Allocator *allocator;
  ScopeData *pSVar2;
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U> *this;
  int iVar3;
  uint uVar4;
  VariableData **ppVVar5;
  undefined4 extraout_var;
  TypeUnsizedArray *type;
  undefined4 extraout_var_00;
  VariableData *this_00;
  SynIdentifier *name;
  undefined4 extraout_var_03;
  char *__function;
  VariableData *variable;
  SynBase *local_60;
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U> *local_58;
  ScopeData *local_50;
  undefined8 local_48;
  InplaceStr vtableName;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  pTVar1 = function->type->returnType;
  if ((pTVar1 != (TypeBase *)0x0) && (pTVar1->typeID == 0xe)) {
    __assert_fail("!isType<TypeAuto>(function->type->returnType)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1ba5,
                  "ExprBase *GetFunctionTable(ExpressionContext &, SynBase *, FunctionData *)");
  }
  vtableName = GetFunctionTableName(ctx,function);
  ppVVar5 = SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::find
                      (&ctx->vtableMap,&vtableName);
  if (ppVVar5 != (VariableData **)0x0) {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    ExprVariableAccess::ExprVariableAccess
              ((ExprVariableAccess *)CONCAT44(extraout_var,iVar3),source,(*ppVVar5)->type,*ppVVar5);
    return &((ExprVariableAccess *)CONCAT44(extraout_var,iVar3))->super_ExprBase;
  }
  local_58 = &ctx->vtableMap;
  type = ExpressionContext::GetUnsizedArrayType(ctx,ctx->typeFunctionID);
  uVar4 = anon_unknown.dwarf_9fd58::AllocateGlobalVariable
                    (ctx,source,(type->super_TypeStruct).super_TypeBase.alignment,
                     (type->super_TypeStruct).super_TypeBase.size);
  local_48 = CONCAT44(extraout_var_00,uVar4);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
  this_00 = (VariableData *)CONCAT44(extraout_var_01,iVar3);
  allocator = ctx->allocator;
  local_50 = ctx->globalScope;
  uVar4 = (type->super_TypeStruct).super_TypeBase.alignment;
  iVar3 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
  name = (SynIdentifier *)CONCAT44(extraout_var_02,iVar3);
  (name->super_SynBase).typeID = 4;
  (name->super_SynBase).begin = (Lexeme *)0x0;
  (name->super_SynBase).end = (Lexeme *)0x0;
  (name->super_SynBase).pos.begin = (char *)0x0;
  (name->super_SynBase).pos.end = (char *)0x0;
  *(undefined8 *)((long)&(name->super_SynBase).pos.end + 2) = 0;
  *(undefined8 *)((long)&(name->super_SynBase).next + 2) = 0;
  (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
  (name->name).begin = vtableName.begin;
  (name->name).end = vtableName.end;
  uniqueId = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uniqueId + 1;
  local_60 = source;
  VariableData::VariableData
            (this_00,allocator,source,local_50,uVar4,(TypeBase *)type,name,(uint)local_48,uniqueId);
  pSVar2 = ctx->globalScope;
  uVar4 = (pSVar2->variables).count;
  variable = this_00;
  if (uVar4 == (pSVar2->variables).max) {
    SmallArray<VariableData_*,_4U>::grow(&pSVar2->variables,uVar4);
  }
  this = local_58;
  ppVVar5 = (pSVar2->variables).data;
  if (ppVVar5 != (VariableData **)0x0) {
    uVar4 = (pSVar2->variables).count;
    (pSVar2->variables).count = uVar4 + 1;
    ppVVar5[uVar4] = variable;
    pSVar2 = ctx->globalScope;
    uVar4 = (pSVar2->allVariables).count;
    if (uVar4 == (pSVar2->allVariables).max) {
      SmallArray<VariableData_*,_4U>::grow(&pSVar2->allVariables,uVar4);
    }
    ppVVar5 = (pSVar2->allVariables).data;
    if (ppVVar5 != (VariableData **)0x0) {
      uVar4 = (pSVar2->allVariables).count;
      (pSVar2->allVariables).count = uVar4 + 1;
      ppVVar5[uVar4] = variable;
      uVar4 = (ctx->variables).count;
      if (uVar4 == (ctx->variables).max) {
        SmallArray<VariableData_*,_128U>::grow(&ctx->variables,uVar4);
      }
      ppVVar5 = (ctx->variables).data;
      if (ppVVar5 != (VariableData **)0x0) {
        uVar4 = (ctx->variables).count;
        (ctx->variables).count = uVar4 + 1;
        ppVVar5[uVar4] = variable;
        uVar4 = (ctx->vtables).count;
        if (uVar4 == (ctx->vtables).max) {
          SmallArray<VariableData_*,_128U>::grow(&ctx->vtables,uVar4);
        }
        ppVVar5 = (ctx->vtables).data;
        if (ppVVar5 != (VariableData **)0x0) {
          uVar4 = (ctx->vtables).count;
          (ctx->vtables).count = uVar4 + 1;
          ppVVar5[uVar4] = variable;
          SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::insert
                    (this,&vtableName,&variable);
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          ExprVariableAccess::ExprVariableAccess
                    ((ExprVariableAccess *)CONCAT44(extraout_var_03,iVar3),local_60,variable->type,
                     variable);
          return &((ExprVariableAccess *)CONCAT44(extraout_var_03,iVar3))->super_ExprBase;
        }
      }
      __function = 
      "void SmallArray<VariableData *, 128>::push_back(const T &) [T = VariableData *, N = 128]";
      goto LAB_001649bc;
    }
  }
  __function = 
  "void SmallArray<VariableData *, 4>::push_back(const T &) [T = VariableData *, N = 4]";
LAB_001649bc:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

ExprBase* GetFunctionTable(ExpressionContext &ctx, SynBase *source, FunctionData *function)
{
	assert(!isType<TypeAuto>(function->type->returnType));

	InplaceStr vtableName = GetFunctionTableName(ctx, function);

	if(VariableData **variable = ctx.vtableMap.find(vtableName))
	{
		return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, (*variable)->type, *variable);
	}
	
	TypeBase *type = ctx.GetUnsizedArrayType(ctx.typeFunctionID);

	unsigned offset = AllocateGlobalVariable(ctx, source, type->alignment, type->size);
	VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.globalScope, type->alignment, type, new (ctx.get<SynIdentifier>()) SynIdentifier(vtableName), offset, ctx.uniqueVariableId++);

	ctx.globalScope->variables.push_back(variable);
	ctx.globalScope->allVariables.push_back(variable);

	ctx.variables.push_back(variable);

	ctx.vtables.push_back(variable);
	ctx.vtableMap.insert(vtableName, variable);

	return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, variable->type, variable);
}